

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_aspect.c
# Opt level: O2

int log_aspect_notify_first
              (log_aspect aspect,log_aspect_notify_cb notify_cb,log_aspect_notify_data notify_data)

{
  int iVar1;
  ulong uVar2;
  
  uVar2 = 0;
  while( true ) {
    if (aspect->count <= uVar2) {
      return 1;
    }
    if ((aspect->policies[uVar2] != (log_policy)0x0) &&
       (iVar1 = (*notify_cb)(aspect,aspect->policies[uVar2],notify_data), iVar1 == 0)) break;
    uVar2 = uVar2 + 1;
  }
  return 0;
}

Assistant:

int log_aspect_notify_first(log_aspect aspect, log_aspect_notify_cb notify_cb, log_aspect_notify_data notify_data)
{
	size_t iterator;

	for (iterator = 0; iterator < aspect->count; ++iterator)
	{
		if (aspect->policies[iterator] != NULL)
		{
			if (notify_cb(aspect, aspect->policies[iterator], notify_data) == 0)
			{
				return 0;
			}
		}
	}

	return 1;
}